

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

void __thiscall
pbrt::Transform::Decompose(Transform *this,Vector3f *T,SquareMatrix<4> *R,SquareMatrix<4> *S)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [64];
  int i_3;
  Float (*paFVar6) [4];
  undefined1 (*pauVar7) [16];
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  Float *pFVar13;
  Float aFVar14 [4];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  SquareMatrix<4> Rnext;
  SquareMatrix<4> r;
  SquareMatrix<4> Rit;
  code *pcStack_160;
  Float local_158;
  float fStack_154;
  Float FStack_150;
  float fStack_14c;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  char local_118;
  undefined8 local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined8 uStack_e4;
  undefined1 auStack_dc [16];
  undefined4 uStack_cc;
  Float local_c8;
  float fStack_c4;
  Float FStack_c0;
  float fStack_bc;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  Float local_88;
  float fStack_84;
  Float FStack_80;
  float fStack_7c;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined1 local_48 [32];
  
  pFVar13 = &local_158;
  uVar12 = 0;
  auVar17 = vpmovsxbq_avx2(ZEXT416(0x3020100));
  (T->super_Tuple3<pbrt::Vector3,_float>).x = (this->m).m[0][3];
  (T->super_Tuple3<pbrt::Vector3,_float>).y = (this->m).m[1][3];
  (T->super_Tuple3<pbrt::Vector3,_float>).z = (this->m).m[2][3];
  uVar4 = *(undefined8 *)(this->m).m[1];
  uStack_e4 = *(undefined8 *)((this->m).m[2] + 1);
  uStack_e8 = (undefined4)((ulong)*(undefined8 *)((this->m).m[1] + 3) >> 0x20);
  local_108 = *(undefined8 *)(this->m).m[0];
  uStack_100 = (undefined4)*(undefined8 *)((this->m).m[0] + 2);
  uStack_f8 = (undefined4)uVar4;
  uStack_f4 = (undefined4)((ulong)uVar4 >> 0x20);
  uStack_f0 = (undefined4)*(undefined8 *)((this->m).m[1] + 2);
  uStack_fc = 0;
  uStack_ec = 0;
  auVar15 = vpbroadcastq_avx512vl();
  local_48 = vpaddq_avx2(auVar15,_DAT_004a9b80);
  auStack_dc = ZEXT816(0) << 0x20;
  uStack_cc = 0x3f800000;
  auVar18._12_4_ = 0;
  auVar18._0_12_ = *(undefined1 (*) [12])(this->m).m[0];
  auVar18._16_4_ = uStack_f8;
  auVar18._20_4_ = uStack_f4;
  auVar18._24_4_ = uStack_f0;
  auVar18._28_4_ = 0;
  auVar18._32_4_ = uStack_e8;
  auVar18._36_8_ = uStack_e4;
  auVar18._44_16_ = ZEXT816(0) << 0x20;
  auVar18._60_4_ = 0x3f800000;
  *(undefined1 (*) [64])R->m = auVar18;
  do {
    auVar15 = local_48;
    lVar8 = 0;
    paFVar6 = (Float (*) [4])&local_c8;
    do {
      auVar16 = vpbroadcastq_avx512vl();
      lVar8 = lVar8 + 1;
      uVar3 = vpcmpeqq_avx512vl(auVar16,auVar17);
      auVar19 = vpmovm2d_avx512vl(uVar3 & 0xf);
      auVar19 = vpsrld_avx(auVar19,0x1f);
      aFVar14 = (Float  [4])vcvtdq2ps_avx(auVar19);
      *paFVar6 = aFVar14;
      paFVar6 = paFVar6 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    paFVar6 = (Float (*) [4])&local_c8;
    do {
      auVar17 = vpbroadcastq_avx512vl();
      lVar8 = lVar8 + 1;
      auVar17 = vpsllq_avx2(auVar17,2);
      vpaddq_avx2(auVar15,auVar17);
      aFVar14 = (Float  [4])vgatherqps_avx512vl(*(undefined8 *)*paFVar6);
      *paFVar6 = aFVar14;
      paFVar6 = paFVar6 + 1;
    } while (lVar8 != 4);
    pcStack_160 = (code *)0x31bfcf;
    Inverse<4>((SquareMatrix<4> *)&local_c8);
    if (local_118 == '\0') goto LAB_0031c1b2;
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    lVar8 = 0;
    local_88 = local_158;
    fStack_84 = fStack_154;
    FStack_80 = FStack_150;
    fStack_7c = fStack_14c;
    uStack_78 = uStack_148;
    uStack_70 = uStack_140;
    uStack_68 = uStack_138;
    uStack_60 = uStack_130;
    uStack_58 = uStack_128;
    uStack_50 = uStack_120;
    _local_c8 = *(undefined8 *)R->m[0];
    _FStack_c0 = *(undefined8 *)(R->m[0] + 2);
    uStack_b8 = *(undefined8 *)R->m[1];
    uStack_b0 = *(undefined8 *)(R->m[1] + 2);
    uStack_a8 = *(undefined8 *)R->m[2];
    uStack_a0 = *(undefined8 *)(R->m[2] + 2);
    uStack_98 = *(undefined8 *)R->m[3];
    uStack_90 = *(undefined8 *)(R->m[3] + 2);
    do {
      *(float *)((long)&local_c8 + lVar8) =
           *(float *)((long)&local_88 + lVar8) + *(float *)((long)&local_c8 + lVar8);
      *(float *)((long)&fStack_c4 + lVar8) =
           *(float *)((long)&fStack_84 + lVar8) + *(float *)((long)&fStack_c4 + lVar8);
      *(float *)((long)&FStack_c0 + lVar8) =
           *(float *)((long)&FStack_80 + lVar8) + *(float *)((long)&FStack_c0 + lVar8);
      *(float *)((long)&fStack_bc + lVar8) =
           *(float *)((long)&fStack_7c + lVar8) + *(float *)((long)&fStack_bc + lVar8);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    auVar17 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    lVar8 = 0;
    local_158 = local_c8;
    fStack_154 = fStack_c4;
    FStack_150 = FStack_c0;
    fStack_14c = fStack_bc;
    uStack_148 = uStack_b8;
    uStack_140 = uStack_b0;
    uStack_138 = uStack_a8;
    uStack_130 = uStack_a0;
    uStack_128 = uStack_98;
    uStack_120 = uStack_90;
    do {
      *(float *)((long)&local_158 + lVar8) = *(float *)((long)&local_158 + lVar8) * 0.5;
      *(float *)((long)&fStack_154 + lVar8) = *(float *)((long)&fStack_154 + lVar8) * 0.5;
      *(float *)((long)&FStack_150 + lVar8) = *(float *)((long)&FStack_150 + lVar8) * 0.5;
      *(float *)((long)&fStack_14c + lVar8) = *(float *)((long)&fStack_14c + lVar8) * 0.5;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x40);
    auVar20 = ZEXT416(0) << 0x20;
    lVar8 = 8;
    do {
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)((long)(R->m + -1) + 8 + lVar8);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)((long)&pcStack_160 + lVar8);
      auVar21 = vsubps_avx(auVar21,auVar22);
      pfVar1 = (float *)((long)R->m[0] + lVar8);
      pfVar2 = (float *)((long)&local_158 + lVar8);
      lVar8 = lVar8 + 0x10;
      auVar21 = vandps_avx(auVar21,auVar19);
      auVar22 = vhaddps_avx(auVar21,auVar21);
      auVar21 = vandps_avx(ZEXT416((uint)(*pfVar1 - *pfVar2)),auVar19);
      auVar20 = vmaxss_avx(ZEXT416((uint)(auVar22._0_4_ + auVar21._0_4_)),auVar20);
    } while (lVar8 != 0x38);
    auVar5._8_4_ = FStack_150;
    auVar5._12_4_ = fStack_14c;
    auVar5._0_4_ = local_158;
    auVar5._4_4_ = fStack_154;
    auVar5._16_8_ = uStack_148;
    auVar5._24_8_ = uStack_140;
    auVar5._32_8_ = uStack_138;
    auVar5._40_8_ = uStack_130;
    auVar5._48_8_ = uStack_128;
    auVar5._56_8_ = uStack_120;
    auVar18 = vmovdqu64_avx512f(auVar5);
    auVar18 = vmovdqu64_avx512f(auVar18);
    *(undefined1 (*) [64])R->m = auVar18;
    if (0x62 < uVar12) break;
    uVar12 = uVar12 + 1;
  } while (0.0001 < auVar20._0_4_);
  pcStack_160 = (code *)0x31c0ec;
  Inverse<4>(R);
  if (local_118 != '\0') {
    auVar17 = vpmovsxbq_avx2(ZEXT416(0x3020100));
    pauVar7 = (undefined1 (*) [16])&local_88;
    lVar8 = 0;
    do {
      auVar15 = vpbroadcastq_avx512vl();
      lVar8 = lVar8 + 1;
      uVar3 = vpcmpeqq_avx512vl(auVar15,auVar17);
      auVar19 = vpmovm2d_avx512vl(uVar3 & 0xf);
      auVar19 = vpsrld_avx(auVar19,0x1f);
      auVar19 = vcvtdq2ps_avx(auVar19);
      *pauVar7 = auVar19;
      pauVar7 = pauVar7 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    do {
      lVar10 = 0;
      puVar9 = &local_108;
      do {
        auVar19 = ZEXT816(0) << 0x40;
        lVar11 = 0;
        do {
          auVar19 = vfmadd231ss_fma(auVar19,ZEXT416(*(uint *)((long)pFVar13 + lVar11)),
                                    ZEXT416(*(uint *)((long)puVar9 + lVar11 * 4)));
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x10);
        (&local_88)[lVar8 * 4 + lVar10] = auVar19._0_4_;
        lVar10 = lVar10 + 1;
        puVar9 = (undefined8 *)((long)puVar9 + 4);
      } while (lVar10 != 4);
      lVar8 = lVar8 + 1;
      pFVar13 = (Float *)((long)pFVar13 + 0x10);
    } while (lVar8 != 4);
    *(undefined8 *)S->m[0] = _local_88;
    *(undefined8 *)(S->m[0] + 2) = _FStack_80;
    *(undefined8 *)S->m[1] = uStack_78;
    *(undefined8 *)(S->m[1] + 2) = uStack_70;
    *(undefined8 *)S->m[2] = uStack_68;
    *(undefined8 *)(S->m[2] + 2) = uStack_60;
    *(undefined8 *)S->m[3] = uStack_58;
    *(undefined8 *)(S->m[3] + 2) = uStack_50;
    return;
  }
LAB_0031c1b2:
  pcStack_160 = operator();
  LogFatal<char_const(&)[4]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
             ,0xea,"Check failed: %s",(char (*) [4])0x2f54c6d);
}

Assistant:

void Transform::Decompose(Vector3f *T, SquareMatrix<4> *R, SquareMatrix<4> *S) const {
    // Extract translation _T_ from transformation matrix
    T->x = m[0][3];
    T->y = m[1][3];
    T->z = m[2][3];

    // Compute new transformation matrix _M_ without translation
    SquareMatrix<4> M = m;
    for (int i = 0; i < 3; ++i)
        M[i][3] = M[3][i] = 0.f;
    M[3][3] = 1.f;

    // Extract rotation _R_ from transformation matrix
    Float norm;
    int count = 0;
    *R = M;
    do {
        // Compute next matrix _Rnext_ in series
        SquareMatrix<4> Rit = *Inverse(Transpose(*R));
        SquareMatrix<4> Rnext = (*R + Rit) / 2;

        // Compute norm of difference between _R_ and _Rnext_
        norm = 0;
        for (int i = 0; i < 3; ++i) {
            Float n = std::abs((*R)[i][0] - Rnext[i][0]) +
                      std::abs((*R)[i][1] - Rnext[i][1]) +
                      std::abs((*R)[i][2] - Rnext[i][2]);
            norm = std::max(norm, n);
        }

        *R = Rnext;
    } while (++count < 100 && norm > .0001);
    // XXX TODO FIXME deal with flip...

    // Compute scale _S_ using rotation and original matrix
    *S = *Inverse(*R) * M;
}